

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenPackUnPack_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,IDLOptions *opts,
          bool struct_has_create,
          set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
          *field_has_create)

{
  Value *pVVar1;
  FieldDef *pFVar2;
  StructDef *pSVar3;
  bool bVar4;
  __type _Var5;
  char *pcVar6;
  reference ppFVar7;
  char *local_1f60;
  byte local_1f51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c98;
  string local_1c78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bb8;
  undefined1 local_1b98 [8];
  string camel_name_3;
  FieldDef *field_3;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1b68;
  iterator it_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a80;
  string local_1a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1980;
  undefined1 local_1960 [8];
  string camel_name_2;
  FieldDef *field_2;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1930;
  iterator it_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1908;
  undefined8 local_18e8;
  StructDef *pSStack_18e0;
  EnumDef *local_18d8;
  undefined8 uStack_18d0;
  string local_18c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17c0;
  string local_17a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1600;
  undefined1 local_15e0 [8];
  FieldArrayLength tmp_array_length_1;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  array_lengths_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1400;
  byte local_13db;
  byte local_13da;
  byte local_13d9;
  string local_13d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1398;
  byte local_1374;
  byte local_1373;
  byte local_1372;
  byte local_1371;
  Type local_1370;
  string local_1350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0;
  undefined1 local_12d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pack_method;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0;
  string local_f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  string local_ed0;
  string local_eb0 [32];
  string local_e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  string local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  allocator<char> local_d29;
  undefined1 local_d28 [8];
  string create_string_1;
  undefined1 local_d00 [8];
  string to_array;
  undefined1 local_cd8 [8];
  string array_type;
  string array_name;
  undefined1 local_c90 [7];
  bool gen_for_loop;
  string property_name;
  FieldDef *local_c68;
  _Self local_c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  allocator<char> local_b51;
  undefined1 local_b50 [8];
  string create_string;
  FieldArrayLength tmp_array_length;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  array_lengths;
  string local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 local_970 [8];
  string camel_name_short_1;
  string camel_name_1;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_920;
  iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  string local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined8 local_678;
  StructDef *pSStack_670;
  EnumDef *local_668;
  undefined8 uStack_660;
  string local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  byte local_5c9;
  undefined1 local_5c8 [7];
  bool fixed_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  undefined8 local_588;
  StructDef *pSStack_580;
  EnumDef *local_578;
  undefined8 uStack_570;
  string local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  char *local_340;
  char *unpack_method;
  string length_str;
  undefined1 local_2f0 [8];
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  byte local_1c9;
  undefined1 local_1c8 [7];
  bool fixed;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> start;
  string camel_name_short;
  string camel_name;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_138;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string struct_name;
  string *code;
  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  *field_has_create_local;
  bool struct_has_create_local;
  IDLOptions *opts_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  struct_name.field_2._8_8_ = code_ptr;
  GenTypeName_ObjectAPI((string *)local_60,this,(string *)struct_def,opts);
  std::operator+(&local_a0,"  public ",(string *)local_60);
  std::operator+(&local_80,&local_a0," UnPack() {\n");
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::operator+(&local_f0,"    var _o = new ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(&local_d0,&local_f0,"();\n");
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"    this.UnPackTo(_o);\n");
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"    return _o;\n");
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"  }\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 "  public void UnPackTo(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                 ," _o) {\n");
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&it);
  local_138._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar4 = __gnu_cxx::operator!=
                      (&local_138,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar4) break;
    ppFVar7 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_138);
    pFVar2 = *ppFVar7;
    if ((pFVar2->deprecated & 1U) == 0) {
      Name_abi_cxx11_((string *)((long)&camel_name_short.field_2 + 8),this,pFVar2);
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&camel_name_short.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              struct_def);
      if (_Var5) {
        std::__cxx11::string::operator+=((string *)(camel_name_short.field_2._M_local_buf + 8),"_");
      }
      Name_abi_cxx11_((string *)((long)&start.field_2 + 8),this,pFVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     "    _o.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&camel_name_short.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     " = ");
      std::__cxx11::string::~string((string *)local_1c8);
      switch((pFVar2->value).type.base_type) {
      case BASE_TYPE_UTYPE:
        break;
      default:
        std::operator+(&local_818,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"this.");
        std::operator+(&local_7f8,&local_818,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short.field_2 + 8));
        std::operator+(&local_7d8,&local_7f8,";\n");
        std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_7d8);
        std::__cxx11::string::~string((string *)&local_7d8);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_818);
        break;
      case BASE_TYPE_VECTOR:
        if ((pFVar2->value).type.element == BASE_TYPE_UNION) {
          std::operator+(&local_540,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"new ");
          pVVar1 = &pFVar2->value;
          local_588._0_4_ = (pVVar1->type).base_type;
          local_588._4_4_ = (pVVar1->type).element;
          pSStack_580 = (pFVar2->value).type.struct_def;
          local_578 = (pFVar2->value).type.enum_def;
          uStack_570 = *(undefined8 *)&(pFVar2->value).type.fixed_length;
          GenTypeGet_ObjectAPI_abi_cxx11_(&local_560,this,pVVar1->type,opts);
          std::operator+(&local_520,&local_540,&local_560);
          std::operator+(&local_500,&local_520,"();\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_500)
          ;
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_540);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5c8,"    for (var _j = 0; _j < this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short.field_2 + 8));
          std::operator+(&local_5a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5c8,"Length; ++_j) {\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_5a8)
          ;
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)local_5c8);
          GenUnionUnPack_ObjectAPI
                    (this,(pFVar2->value).type.enum_def,code_ptr,
                     (string *)((long)&camel_name_short.field_2 + 8),
                     (string *)((long)&start.field_2 + 8),true);
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"    }\n");
        }
        else if ((pFVar2->value).type.element != BASE_TYPE_UTYPE) {
          local_5c9 = (pFVar2->value).type.struct_def == (StructDef *)0x0;
          std::operator+(&local_630,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"new ");
          pVVar1 = &pFVar2->value;
          local_678._0_4_ = (pVVar1->type).base_type;
          local_678._4_4_ = (pVVar1->type).element;
          pSStack_670 = (pFVar2->value).type.struct_def;
          local_668 = (pFVar2->value).type.enum_def;
          uStack_660 = *(undefined8 *)&(pFVar2->value).type.fixed_length;
          GenTypeGet_ObjectAPI_abi_cxx11_(&local_650,this,pVVar1->type,opts);
          std::operator+(&local_610,&local_630,&local_650);
          std::operator+(&local_5f0,&local_610,"();\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_5f0)
          ;
          std::__cxx11::string::~string((string *)&local_5f0);
          std::__cxx11::string::~string((string *)&local_610);
          std::__cxx11::string::~string((string *)&local_650);
          std::__cxx11::string::~string((string *)&local_630);
          std::operator+(&local_6b8,"    for (var _j = 0; _j < this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short.field_2 + 8));
          std::operator+(&local_698,&local_6b8,"Length; ++_j) {");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_698)
          ;
          std::__cxx11::string::~string((string *)&local_698);
          std::__cxx11::string::~string((string *)&local_6b8);
          std::operator+(&local_6f8,"_o.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short.field_2 + 8));
          std::operator+(&local_6d8,&local_6f8,".Add(");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_6d8)
          ;
          std::__cxx11::string::~string((string *)&local_6d8);
          std::__cxx11::string::~string((string *)&local_6f8);
          if ((local_5c9 & 1) == 0) {
            std::operator+(&local_7b8,"this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&camel_name_short.field_2 + 8));
            std::operator+(&local_798,&local_7b8,"(_j).HasValue ? this.");
            std::operator+(&local_778,&local_798,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&camel_name_short.field_2 + 8));
            std::operator+(&local_758,&local_778,"(_j).Value.UnPack() : null");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_758);
            std::__cxx11::string::~string((string *)&local_758);
            std::__cxx11::string::~string((string *)&local_778);
            std::__cxx11::string::~string((string *)&local_798);
            std::__cxx11::string::~string((string *)&local_7b8);
          }
          else {
            std::operator+(&local_738,"this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&camel_name_short.field_2 + 8));
            std::operator+(&local_718,&local_738,"(_j)");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_718);
            std::__cxx11::string::~string((string *)&local_718);
            std::__cxx11::string::~string((string *)&local_738);
          }
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,");}\n");
        }
        break;
      case BASE_TYPE_STRUCT:
        local_1f51 = 0;
        if ((struct_def->fixed & 1U) != 0) {
          local_1f51 = ((pFVar2->value).type.struct_def)->fixed;
        }
        local_1c9 = local_1f51 & 1;
        if (local_1c9 == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type_name.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"this.");
          std::operator+(&local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type_name.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short.field_2 + 8));
          std::operator+(&local_290,&local_2b0,".HasValue ? this.");
          std::operator+(&local_270,&local_290,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short.field_2 + 8));
          std::operator+(&local_250,&local_270,".Value.UnPack() : null;\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_250)
          ;
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
        }
        else {
          std::operator+(&local_230,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"this.");
          std::operator+(&local_210,&local_230,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short.field_2 + 8));
          std::operator+(&local_1f0,&local_210,".UnPack();\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_1f0)
          ;
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_230);
        }
        break;
      case BASE_TYPE_UNION:
        GenUnionUnPack_ObjectAPI
                  (this,(pFVar2->value).type.enum_def,code_ptr,
                   (string *)((long)&camel_name_short.field_2 + 8),
                   (string *)((long)&start.field_2 + 8),false);
        break;
      case BASE_TYPE_ARRAY:
        pVVar1 = &pFVar2->value;
        length_str.field_2._8_4_ = (pVVar1->type).base_type;
        length_str.field_2._12_4_ = (pVVar1->type).element;
        GenTypeGet_ObjectAPI_abi_cxx11_((string *)local_2f0,this,pVVar1->type,opts);
        NumToString<unsigned_short>((string *)&unpack_method,(pFVar2->value).type.fixed_length);
        if ((pFVar2->value).type.struct_def == (StructDef *)0x0) {
          local_1f60 = "";
        }
        else {
          local_1f60 = "?.UnPack()";
          if ((((pFVar2->value).type.struct_def)->fixed & 1U) != 0) {
            local_1f60 = ".UnPack()";
          }
        }
        local_340 = local_1f60;
        std::operator+(&local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"new ");
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)&local_3e0,(ulong)local_2f0);
        std::operator+(&local_3a0,&local_3c0,&local_3e0);
        std::operator+(&local_380,&local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &unpack_method);
        std::operator+(&local_360,&local_380,"];\n");
        std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::operator+(&local_4e0,"    for (var _j = 0; _j < ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &unpack_method);
        std::operator+(&local_4c0,&local_4e0,"; ++_j) { _o.");
        std::operator+(&local_4a0,&local_4c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short.field_2 + 8));
        std::operator+(&local_480,&local_4a0,"[_j] = this.");
        std::operator+(&local_460,&local_480,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short.field_2 + 8));
        std::operator+(&local_440,&local_460,"(_j)");
        std::operator+(&local_420,&local_440,local_340);
        std::operator+(&local_400,&local_420,"; }\n");
        std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_420);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&unpack_method);
        std::__cxx11::string::~string((string *)local_2f0);
      }
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string((string *)(start.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(camel_name_short.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_138);
  }
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"  }\n");
  GenOffsetType_abi_cxx11_(&local_8b8,this,struct_def);
  std::operator+(&local_898,"  public static ",&local_8b8);
  std::operator+(&local_878,&local_898," Pack(FlatBufferBuilder builder, ");
  std::operator+(&local_858,&local_878,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(&local_838,&local_858," _o) {\n");
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&local_8b8);
  GenOffsetType_abi_cxx11_((string *)&it_1,this,struct_def);
  std::operator+(&local_8f8,"    if (_o == null) return default(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1);
  std::operator+(&local_8d8,&local_8f8,");\n");
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&it_1);
  local_920._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field_1 = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (&(struct_def->fields).vec);
    bVar4 = __gnu_cxx::operator!=
                      (&local_920,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field_1);
    if (!bVar4) break;
    ppFVar7 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_920);
    pFVar2 = *ppFVar7;
    if ((pFVar2->deprecated & 1U) == 0) {
      Name_abi_cxx11_((string *)((long)&camel_name_short_1.field_2 + 8),this,pFVar2);
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&camel_name_short_1.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              struct_def);
      if (_Var5) {
        std::__cxx11::string::operator+=
                  ((string *)(camel_name_short_1.field_2._M_local_buf + 8),"_");
      }
      Name_abi_cxx11_((string *)local_970,this,pFVar2);
      switch((pFVar2->value).type.base_type) {
      case BASE_TYPE_STRING:
        pcVar6 = "CreateString";
        if ((pFVar2->shared & 1U) != 0) {
          pcVar6 = "CreateSharedString";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_b50,pcVar6,&local_b51);
        std::allocator<char>::~allocator(&local_b51);
        std::operator+(&local_c58,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2);
        std::operator+(&local_c38,&local_c58," = _o.");
        std::operator+(&local_c18,&local_c38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short_1.field_2 + 8));
        std::operator+(&local_bf8,&local_c18," == null ? default(StringOffset) : builder.");
        std::operator+(&local_bd8,&local_bf8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b50);
        std::operator+(&local_bb8,&local_bd8,"(_o.");
        std::operator+(&local_b98,&local_bb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short_1.field_2 + 8));
        std::operator+(&local_b78,&local_b98,");\n");
        std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_b78);
        std::__cxx11::string::~string((string *)&local_b78);
        std::__cxx11::string::~string((string *)&local_b98);
        std::__cxx11::string::~string((string *)&local_bb8);
        std::__cxx11::string::~string((string *)&local_bd8);
        std::__cxx11::string::~string((string *)&local_bf8);
        std::__cxx11::string::~string((string *)&local_c18);
        std::__cxx11::string::~string((string *)&local_c38);
        std::__cxx11::string::~string((string *)&local_c58);
        std::__cxx11::string::~string((string *)local_b50);
        break;
      case BASE_TYPE_VECTOR:
        local_c68 = pFVar2;
        local_c60._M_node =
             (_Base_ptr)
             std::
             set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
             ::find(field_has_create,&local_c68);
        property_name.field_2._8_8_ =
             std::
             set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
             ::end(field_has_create);
        bVar4 = std::operator!=(&local_c60,(_Self *)((long)&property_name.field_2 + 8));
        if (bVar4) {
          std::__cxx11::string::string
                    ((string *)local_c90,(string *)(camel_name_short_1.field_2._M_local_buf + 8));
          bVar4 = true;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&array_type.field_2 + 8),"__",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_cd8,"",(allocator<char> *)(to_array.field_2._M_local_buf + 0xf)
                    );
          std::allocator<char>::~allocator((allocator<char> *)(to_array.field_2._M_local_buf + 0xf))
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d00,"",
                     (allocator<char> *)(create_string_1.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(create_string_1.field_2._M_local_buf + 0xf));
          switch((pFVar2->value).type.element) {
          case BASE_TYPE_UTYPE:
            std::__cxx11::string::size();
            std::__cxx11::string::substr
                      ((ulong)local_eb0,(ulong)((long)&camel_name_short_1.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_c90,local_eb0);
            std::__cxx11::string::~string(local_eb0);
            NamespacedName_abi_cxx11_
                      (&local_ed0,this,&((pFVar2->value).type.enum_def)->super_Definition);
            std::__cxx11::string::operator=((string *)local_cd8,(string *)&local_ed0);
            std::__cxx11::string::~string((string *)&local_ed0);
            std::operator+(&local_f10,"_o.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c90);
            std::operator+(&local_ef0,&local_f10,"[_j].Type");
            std::__cxx11::string::operator=((string *)local_d00,(string *)&local_ef0);
            std::__cxx11::string::~string((string *)&local_ef0);
            std::__cxx11::string::~string((string *)&local_f10);
            break;
          default:
            bVar4 = false;
            break;
          case BASE_TYPE_STRING:
            pcVar6 = "CreateString";
            if ((pFVar2->shared & 1U) != 0) {
              pcVar6 = "CreateSharedString";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_d28,pcVar6,&local_d29);
            std::allocator<char>::~allocator(&local_d29);
            std::__cxx11::string::operator=((string *)local_cd8,"StringOffset");
            std::operator+(&local_db0,"builder.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d28);
            std::operator+(&local_d90,&local_db0,"(_o.");
            std::operator+(&local_d70,&local_d90,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c90);
            std::operator+(&local_d50,&local_d70,"[_j])");
            std::__cxx11::string::operator+=((string *)local_d00,(string *)&local_d50);
            std::__cxx11::string::~string((string *)&local_d50);
            std::__cxx11::string::~string((string *)&local_d70);
            std::__cxx11::string::~string((string *)&local_d90);
            std::__cxx11::string::~string((string *)&local_db0);
            std::__cxx11::string::~string((string *)local_d28);
            break;
          case BASE_TYPE_STRUCT:
            GenTypeGet_abi_cxx11_(&local_e10,this,&(pFVar2->value).type);
            std::operator+(&local_df0,"Offset<",&local_e10);
            std::operator+(&local_dd0,&local_df0,">");
            std::__cxx11::string::operator=((string *)local_cd8,(string *)&local_dd0);
            std::__cxx11::string::~string((string *)&local_dd0);
            std::__cxx11::string::~string((string *)&local_df0);
            std::__cxx11::string::~string((string *)&local_e10);
            GenTypeGet_abi_cxx11_(&local_e90,this,&(pFVar2->value).type);
            std::operator+(&local_e70,&local_e90,".Pack(builder, _o.");
            std::operator+(&local_e50,&local_e70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c90);
            std::operator+(&local_e30,&local_e50,"[_j])");
            std::__cxx11::string::operator=((string *)local_d00,(string *)&local_e30);
            std::__cxx11::string::~string((string *)&local_e30);
            std::__cxx11::string::~string((string *)&local_e50);
            std::__cxx11::string::~string((string *)&local_e70);
            std::__cxx11::string::~string((string *)&local_e90);
            break;
          case BASE_TYPE_UNION:
            std::__cxx11::string::operator=((string *)local_cd8,"int");
            NamespacedName_abi_cxx11_
                      (&local_f90,this,&((pFVar2->value).type.enum_def)->super_Definition);
            std::operator+(&local_f70,&local_f90,"Union.Pack(builder,  _o.");
            std::operator+(&local_f50,&local_f70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c90);
            std::operator+(&local_f30,&local_f50,"[_j])");
            std::__cxx11::string::operator=((string *)local_d00,(string *)&local_f30);
            std::__cxx11::string::~string((string *)&local_f30);
            std::__cxx11::string::~string((string *)&local_f50);
            std::__cxx11::string::~string((string *)&local_f70);
            std::__cxx11::string::~string((string *)&local_f90);
          }
          std::operator+(&local_fd0,"    var _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::operator+(&local_fb0,&local_fd0," = default(VectorOffset);\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_fb0)
          ;
          std::__cxx11::string::~string((string *)&local_fb0);
          std::__cxx11::string::~string((string *)&local_fd0);
          std::operator+(&local_1010,"    if (_o.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c90);
          std::operator+(&local_ff0,&local_1010," != null) {\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_ff0)
          ;
          std::__cxx11::string::~string((string *)&local_ff0);
          std::__cxx11::string::~string((string *)&local_1010);
          if (bVar4) {
            std::operator+(&local_10d0,"      var ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&array_type.field_2 + 8));
            std::operator+(&local_10b0,&local_10d0," = new ");
            std::operator+(&local_1090,&local_10b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_cd8);
            std::operator+(&local_1070,&local_1090,"[_o.");
            std::operator+(&local_1050,&local_1070,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c90);
            std::operator+(&local_1030,&local_1050,".Count];\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_1030);
            std::__cxx11::string::~string((string *)&local_1030);
            std::__cxx11::string::~string((string *)&local_1050);
            std::__cxx11::string::~string((string *)&local_1070);
            std::__cxx11::string::~string((string *)&local_1090);
            std::__cxx11::string::~string((string *)&local_10b0);
            std::__cxx11::string::~string((string *)&local_10d0);
            std::operator+(&local_1110,"      for (var _j = 0; _j < ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&array_type.field_2 + 8));
            std::operator+(&local_10f0,&local_1110,".Length; ++_j) { ");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_10f0);
            std::__cxx11::string::~string((string *)&local_10f0);
            std::__cxx11::string::~string((string *)&local_1110);
            std::operator+(&local_1170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&array_type.field_2 + 8),"[_j] = ");
            std::operator+(&local_1150,&local_1170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d00);
            std::operator+(&local_1130,&local_1150,"; }\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_1130);
            std::__cxx11::string::~string((string *)&local_1130);
            std::__cxx11::string::~string((string *)&local_1150);
            std::__cxx11::string::~string((string *)&local_1170);
          }
          else {
            std::operator+(&local_11f0,"      var ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&array_type.field_2 + 8));
            std::operator+(&local_11d0,&local_11f0," = _o.");
            std::operator+(&local_11b0,&local_11d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c90);
            std::operator+(&local_1190,&local_11b0,".ToArray();\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_1190);
            std::__cxx11::string::~string((string *)&local_1190);
            std::__cxx11::string::~string((string *)&local_11b0);
            std::__cxx11::string::~string((string *)&local_11d0);
            std::__cxx11::string::~string((string *)&local_11f0);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&pack_method.field_2 + 8),"      _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::operator+(&local_1290,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&pack_method.field_2 + 8)," = Create");
          std::operator+(&local_1270,&local_1290,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_970);
          std::operator+(&local_1250,&local_1270,"Vector(builder, ");
          std::operator+(&local_1230,&local_1250,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&array_type.field_2 + 8));
          std::operator+(&local_1210,&local_1230,");\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1210);
          std::__cxx11::string::~string((string *)&local_1210);
          std::__cxx11::string::~string((string *)&local_1230);
          std::__cxx11::string::~string((string *)&local_1250);
          std::__cxx11::string::~string((string *)&local_1270);
          std::__cxx11::string::~string((string *)&local_1290);
          std::__cxx11::string::~string((string *)(pack_method.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"    }\n");
          std::__cxx11::string::~string((string *)local_d00);
          std::__cxx11::string::~string((string *)local_cd8);
          std::__cxx11::string::~string((string *)(array_type.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_c90);
        }
        else {
          local_1371 = 0;
          local_1372 = 0;
          local_1373 = 0;
          local_1374 = 0;
          local_13d9 = 0;
          local_13da = 0;
          local_13db = 0;
          if ((pFVar2->value).type.struct_def == (StructDef *)0x0) {
            Type::VectorType(&local_1370,&(pFVar2->value).type);
            GenMethod_abi_cxx11_(&local_1350,this,&local_1370);
            local_1371 = 1;
            std::operator+(&local_1330,"builder.Add",&local_1350);
            local_1372 = 1;
            std::operator+(&local_1310,&local_1330,"(_o.");
            local_1373 = 1;
            std::operator+(&local_12f0,&local_1310,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&camel_name_short_1.field_2 + 8));
            local_1374 = 1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_12d0,&local_12f0,"[_j]);");
          }
          else {
            GenTypeGet_abi_cxx11_(&local_13d8,this,&(pFVar2->value).type);
            local_13d9 = 1;
            std::operator+(&local_13b8,&local_13d8,".Pack(builder, _o.");
            local_13da = 1;
            std::operator+(&local_1398,&local_13b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&camel_name_short_1.field_2 + 8));
            local_13db = 1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_12d0,&local_1398,"[_j]);");
          }
          if ((local_13db & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1398);
          }
          if ((local_13da & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_13b8);
          }
          if ((local_13d9 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_13d8);
          }
          if ((local_1374 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_12f0);
          }
          if ((local_1373 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1310);
          }
          if ((local_1372 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1330);
          }
          if ((local_1371 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1350);
          }
          std::operator+(&local_1420,"    var _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::operator+(&local_1400,&local_1420," = default(VectorOffset);\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1400);
          std::__cxx11::string::~string((string *)&local_1400);
          std::__cxx11::string::~string((string *)&local_1420);
          std::operator+(&local_1460,"    if (_o.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short_1.field_2 + 8));
          std::operator+(&local_1440,&local_1460," != null) {\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1440);
          std::__cxx11::string::~string((string *)&local_1440);
          std::__cxx11::string::~string((string *)&local_1460);
          std::operator+(&local_14e0,"      Start",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_970);
          std::operator+(&local_14c0,&local_14e0,"Vector(builder, _o.");
          std::operator+(&local_14a0,&local_14c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short_1.field_2 + 8));
          std::operator+(&local_1480,&local_14a0,".Count);\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1480);
          std::__cxx11::string::~string((string *)&local_1480);
          std::__cxx11::string::~string((string *)&local_14a0);
          std::__cxx11::string::~string((string *)&local_14c0);
          std::__cxx11::string::~string((string *)&local_14e0);
          std::operator+(&local_1560,"      for (var _j = _o.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short_1.field_2 + 8));
          std::operator+(&local_1540,&local_1560,".Count - 1; _j >= 0; --_j) { ");
          std::operator+(&local_1520,&local_1540,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_12d0);
          std::operator+(&local_1500,&local_1520," }\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1500);
          std::__cxx11::string::~string((string *)&local_1500);
          std::__cxx11::string::~string((string *)&local_1520);
          std::__cxx11::string::~string((string *)&local_1540);
          std::__cxx11::string::~string((string *)&local_1560);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &array_lengths_1.
                          super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,"      _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::operator+(&local_1580,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &array_lengths_1.
                          super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         " = builder.EndVector();\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1580);
          std::__cxx11::string::~string((string *)&local_1580);
          std::__cxx11::string::~string
                    ((string *)
                     &array_lengths_1.
                      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"    }\n");
          std::__cxx11::string::~string((string *)local_12d0);
        }
        break;
      case BASE_TYPE_STRUCT:
        if ((((pFVar2->value).type.struct_def)->fixed & 1U) == 0) {
          std::operator+(&local_ab0,"    var _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::operator+(&local_a90,&local_ab0," = _o.");
          std::operator+(&local_a70,&local_a90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short_1.field_2 + 8));
          std::operator+(&local_a50,&local_a70," == null ? default(");
          GenOffsetType_abi_cxx11_(&local_ad0,this,(pFVar2->value).type.struct_def);
          std::operator+(&local_a30,&local_a50,&local_ad0);
          std::operator+(&local_a10,&local_a30,") : ");
          GenTypeGet_abi_cxx11_
                    ((string *)
                     &array_lengths.
                      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,this,&(pFVar2->value).type)
          ;
          std::operator+(&local_9f0,&local_a10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &array_lengths.
                          super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::operator+(&local_9d0,&local_9f0,".Pack(builder, _o.");
          std::operator+(&local_9b0,&local_9d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short_1.field_2 + 8));
          std::operator+(&local_990,&local_9b0,");\n");
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_990)
          ;
          std::__cxx11::string::~string((string *)&local_990);
          std::__cxx11::string::~string((string *)&local_9b0);
          std::__cxx11::string::~string((string *)&local_9d0);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::__cxx11::string::~string
                    ((string *)
                     &array_lengths.
                      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)&local_a10);
          std::__cxx11::string::~string((string *)&local_a30);
          std::__cxx11::string::~string((string *)&local_ad0);
          std::__cxx11::string::~string((string *)&local_a50);
          std::__cxx11::string::~string((string *)&local_a70);
          std::__cxx11::string::~string((string *)&local_a90);
          std::__cxx11::string::~string((string *)&local_ab0);
        }
        else if (((struct_def->fixed & 1U) != 0) && (struct_has_create)) {
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    *)&tmp_array_length.length);
          std::__cxx11::string::string
                    ((string *)(create_string.field_2._M_local_buf + 8),(string *)pFVar2);
          tmp_array_length.name.field_2._8_4_ = ZEXT24((pFVar2->value).type.fixed_length);
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       *)&tmp_array_length.length,(value_type *)((long)&create_string.field_2 + 8));
          GenStructPackDecl_ObjectAPI
                    (this,(pFVar2->value).type.struct_def,code_ptr,
                     (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      *)&tmp_array_length.length);
          FieldArrayLength::~FieldArrayLength
                    ((FieldArrayLength *)((long)&create_string.field_2 + 8));
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::~vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                     *)&tmp_array_length.length);
        }
        break;
      case BASE_TYPE_UNION:
        std::operator+(&local_1780,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2);
        std::operator+(&local_1760,&local_1780,"_type = _o.");
        std::operator+(&local_1740,&local_1760,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short_1.field_2 + 8));
        std::operator+(&local_1720,&local_1740," == null ? ");
        NamespacedName_abi_cxx11_
                  (&local_17a0,this,&((pFVar2->value).type.enum_def)->super_Definition);
        std::operator+(&local_1700,&local_1720,&local_17a0);
        std::operator+(&local_16e0,&local_1700,".NONE : ");
        std::operator+(&local_16c0,&local_16e0,"_o.");
        std::operator+(&local_16a0,&local_16c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short_1.field_2 + 8));
        std::operator+(&local_1680,&local_16a0,".Type;\n");
        std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_1680);
        std::__cxx11::string::~string((string *)&local_1680);
        std::__cxx11::string::~string((string *)&local_16a0);
        std::__cxx11::string::~string((string *)&local_16c0);
        std::__cxx11::string::~string((string *)&local_16e0);
        std::__cxx11::string::~string((string *)&local_1700);
        std::__cxx11::string::~string((string *)&local_17a0);
        std::__cxx11::string::~string((string *)&local_1720);
        std::__cxx11::string::~string((string *)&local_1740);
        std::__cxx11::string::~string((string *)&local_1760);
        std::__cxx11::string::~string((string *)&local_1780);
        std::operator+(&local_18a0,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2);
        std::operator+(&local_1880,&local_18a0," = _o.");
        std::operator+(&local_1860,&local_1880,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short_1.field_2 + 8));
        std::operator+(&local_1840,&local_1860," == null ? 0 : ");
        pVVar1 = &pFVar2->value;
        local_18e8._0_4_ = (pVVar1->type).base_type;
        local_18e8._4_4_ = (pVVar1->type).element;
        pSStack_18e0 = (pFVar2->value).type.struct_def;
        local_18d8 = (pFVar2->value).type.enum_def;
        uStack_18d0 = *(undefined8 *)&(pFVar2->value).type.fixed_length;
        GenTypeGet_ObjectAPI_abi_cxx11_(&local_18c0,this,pVVar1->type,opts);
        std::operator+(&local_1820,&local_1840,&local_18c0);
        std::operator+(&local_1800,&local_1820,".Pack(builder, _o.");
        std::operator+(&local_17e0,&local_1800,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&camel_name_short_1.field_2 + 8));
        std::operator+(&local_17c0,&local_17e0,");\n");
        std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_17c0);
        std::__cxx11::string::~string((string *)&local_17c0);
        std::__cxx11::string::~string((string *)&local_17e0);
        std::__cxx11::string::~string((string *)&local_1800);
        std::__cxx11::string::~string((string *)&local_1820);
        std::__cxx11::string::~string((string *)&local_18c0);
        std::__cxx11::string::~string((string *)&local_1840);
        std::__cxx11::string::~string((string *)&local_1860);
        std::__cxx11::string::~string((string *)&local_1880);
        std::__cxx11::string::~string((string *)&local_18a0);
        break;
      case BASE_TYPE_ARRAY:
        if ((pFVar2->value).type.struct_def == (StructDef *)0x0) {
          std::operator+(&local_1660,"    var _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::operator+(&local_1640,&local_1660," = _o.");
          std::operator+(&local_1620,&local_1640,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&camel_name_short_1.field_2 + 8));
          std::operator+(&local_1600,&local_1620,";\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1600);
          std::__cxx11::string::~string((string *)&local_1600);
          std::__cxx11::string::~string((string *)&local_1620);
          std::__cxx11::string::~string((string *)&local_1640);
          std::__cxx11::string::~string((string *)&local_1660);
        }
        else {
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    *)&tmp_array_length_1.length);
          std::__cxx11::string::string((string *)local_15e0,(string *)pFVar2);
          tmp_array_length_1.name.field_2._8_4_ = ZEXT24((pFVar2->value).type.fixed_length);
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       *)&tmp_array_length_1.length,(value_type *)local_15e0);
          GenStructPackDecl_ObjectAPI
                    (this,(pFVar2->value).type.struct_def,code_ptr,
                     (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      *)&tmp_array_length_1.length);
          FieldArrayLength::~FieldArrayLength((FieldArrayLength *)local_15e0);
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::~vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                     *)&tmp_array_length_1.length);
        }
      }
      std::__cxx11::string::~string((string *)local_970);
      std::__cxx11::string::~string((string *)(camel_name_short_1.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_920);
  }
  if (struct_has_create) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                   "    return Create",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_1908,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,"(\n")
    ;
    std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_1908);
    std::__cxx11::string::~string((string *)&local_1908);
    std::__cxx11::string::~string((string *)&it_2);
    std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"      builder");
    local_1930._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(struct_def->fields).vec);
    while( true ) {
      field_2 = (FieldDef *)
                std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                          (&(struct_def->fields).vec);
      bVar4 = __gnu_cxx::operator!=
                        (&local_1930,
                         (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field_2);
      if (!bVar4) break;
      ppFVar7 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_1930);
      camel_name_2.field_2._8_8_ = *ppFVar7;
      if ((((FieldDef *)camel_name_2.field_2._8_8_)->deprecated & 1U) == 0) {
        Name_abi_cxx11_((string *)local_1960,this,(FieldDef *)camel_name_2.field_2._8_8_);
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1960,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )struct_def);
        if (_Var5) {
          std::__cxx11::string::operator+=((string *)local_1960,"_");
        }
        switch(*(undefined4 *)(camel_name_2.field_2._8_8_ + 200)) {
        default:
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,",\n");
          std::operator+(&local_1b20,"      _o.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1960);
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1b20);
          std::__cxx11::string::~string((string *)&local_1b20);
          break;
        case 0xf:
          if ((struct_def->fixed & 1U) == 0) {
            std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,",\n");
            if ((*(byte *)(*(long *)(camel_name_2.field_2._8_8_ + 0xd0) + 0x110) & 1) == 0) {
              std::operator+(&local_1a80,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             camel_name_2.field_2._8_8_);
              std::__cxx11::string::operator+=
                        ((string *)struct_name.field_2._8_8_,(string *)&local_1a80);
              std::__cxx11::string::~string((string *)&local_1a80);
            }
            else if ((opts->generate_object_based_api & 1U) == 0) {
              GenTypeGet_abi_cxx11_(&local_1a60,this,(Type *)(camel_name_2.field_2._8_8_ + 200));
              std::operator+(&local_1a40,"      ",&local_1a60);
              std::operator+(&local_1a20,&local_1a40,".Pack(builder, _o.");
              std::operator+(&local_1a00,&local_1a20,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1960);
              std::operator+(&local_19e0,&local_1a00,")");
              std::__cxx11::string::operator+=
                        ((string *)struct_name.field_2._8_8_,(string *)&local_19e0);
              std::__cxx11::string::~string((string *)&local_19e0);
              std::__cxx11::string::~string((string *)&local_1a00);
              std::__cxx11::string::~string((string *)&local_1a20);
              std::__cxx11::string::~string((string *)&local_1a40);
              std::__cxx11::string::~string((string *)&local_1a60);
            }
            else {
              std::operator+(&local_19c0,"      _o.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1960);
              std::__cxx11::string::operator+=
                        ((string *)struct_name.field_2._8_8_,(string *)&local_19c0);
              std::__cxx11::string::~string((string *)&local_19c0);
            }
          }
          else {
            pSVar3 = *(StructDef **)(camel_name_2.field_2._8_8_ + 0xd0);
            std::operator+(&local_19a0,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           camel_name_2.field_2._8_8_);
            std::operator+(&local_1980,&local_19a0,"_");
            GenStructPackCall_ObjectAPI(this,pSVar3,code_ptr,&local_1980);
            std::__cxx11::string::~string((string *)&local_1980);
            std::__cxx11::string::~string((string *)&local_19a0);
          }
          break;
        case 0x10:
        case 1:
        case 0xd:
        case 0xe:
          std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,",\n");
          std::operator+(&local_1b00,"      _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         camel_name_2.field_2._8_8_);
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1b00);
          std::__cxx11::string::~string((string *)&local_1b00);
          break;
        case 0x11:
          if (*(long *)(camel_name_2.field_2._8_8_ + 0xd0) == 0) {
            std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,",\n");
            std::operator+(&local_1ae0,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           camel_name_2.field_2._8_8_);
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_1ae0);
            std::__cxx11::string::~string((string *)&local_1ae0);
          }
          else {
            pSVar3 = *(StructDef **)(camel_name_2.field_2._8_8_ + 0xd0);
            std::operator+(&local_1ac0,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           camel_name_2.field_2._8_8_);
            std::operator+(&local_1aa0,&local_1ac0,"_");
            GenStructPackCall_ObjectAPI(this,pSVar3,code_ptr,&local_1aa0);
            std::__cxx11::string::~string((string *)&local_1aa0);
            std::__cxx11::string::~string((string *)&local_1ac0);
          }
        }
        std::__cxx11::string::~string((string *)local_1960);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_1930);
    }
    std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,");\n");
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_3,
                   "    Start",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_1b40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_3,
                   "(builder);\n");
    std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_1b40);
    std::__cxx11::string::~string((string *)&local_1b40);
    std::__cxx11::string::~string((string *)&it_3);
    local_1b68._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(struct_def->fields).vec);
    while( true ) {
      field_3 = (FieldDef *)
                std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                          (&(struct_def->fields).vec);
      bVar4 = __gnu_cxx::operator!=
                        (&local_1b68,
                         (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field_3);
      if (!bVar4) break;
      ppFVar7 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_1b68);
      camel_name_3.field_2._8_8_ = *ppFVar7;
      if ((((FieldDef *)camel_name_3.field_2._8_8_)->deprecated & 1U) == 0) {
        Name_abi_cxx11_((string *)local_1b98,this,(FieldDef *)camel_name_3.field_2._8_8_);
        switch(*(undefined4 *)(camel_name_3.field_2._8_8_ + 200)) {
        case 1:
          break;
        default:
          std::operator+(&local_1ef8,"    Add",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b98);
          std::operator+(&local_1ed8,&local_1ef8,"(builder, _o.");
          std::operator+(&local_1eb8,&local_1ed8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b98);
          std::operator+(&local_1e98,&local_1eb8,");\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1e98);
          std::__cxx11::string::~string((string *)&local_1e98);
          std::__cxx11::string::~string((string *)&local_1eb8);
          std::__cxx11::string::~string((string *)&local_1ed8);
          std::__cxx11::string::~string((string *)&local_1ef8);
          break;
        case 0xd:
        case 0x11:
        case 0xe:
          std::operator+(&local_1d78,"    Add",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b98);
          std::operator+(&local_1d58,&local_1d78,"(builder, _");
          std::operator+(&local_1d38,&local_1d58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         camel_name_3.field_2._8_8_);
          std::operator+(&local_1d18,&local_1d38,");\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1d18);
          std::__cxx11::string::~string((string *)&local_1d18);
          std::__cxx11::string::~string((string *)&local_1d38);
          std::__cxx11::string::~string((string *)&local_1d58);
          std::__cxx11::string::~string((string *)&local_1d78);
          break;
        case 0xf:
          if ((*(byte *)(*(long *)(camel_name_3.field_2._8_8_ + 0xd0) + 0x110) & 1) == 0) {
            std::operator+(&local_1cf8,"    Add",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b98);
            std::operator+(&local_1cd8,&local_1cf8,"(builder, _");
            std::operator+(&local_1cb8,&local_1cd8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           camel_name_3.field_2._8_8_);
            std::operator+(&local_1c98,&local_1cb8,");\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_1c98);
            std::__cxx11::string::~string((string *)&local_1c98);
            std::__cxx11::string::~string((string *)&local_1cb8);
            std::__cxx11::string::~string((string *)&local_1cd8);
            std::__cxx11::string::~string((string *)&local_1cf8);
          }
          else {
            std::operator+(&local_1c58,"    Add",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b98);
            std::operator+(&local_1c38,&local_1c58,"(builder, ");
            GenTypeGet_abi_cxx11_(&local_1c78,this,(Type *)(camel_name_3.field_2._8_8_ + 200));
            std::operator+(&local_1c18,&local_1c38,&local_1c78);
            std::operator+(&local_1bf8,&local_1c18,".Pack(builder, _o.");
            std::operator+(&local_1bd8,&local_1bf8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b98);
            std::operator+(&local_1bb8,&local_1bd8,"));\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_name.field_2._8_8_,(string *)&local_1bb8);
            std::__cxx11::string::~string((string *)&local_1bb8);
            std::__cxx11::string::~string((string *)&local_1bd8);
            std::__cxx11::string::~string((string *)&local_1bf8);
            std::__cxx11::string::~string((string *)&local_1c18);
            std::__cxx11::string::~string((string *)&local_1c78);
            std::__cxx11::string::~string((string *)&local_1c38);
            std::__cxx11::string::~string((string *)&local_1c58);
          }
          break;
        case 0x10:
          std::operator+(&local_1df8,"    Add",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b98);
          std::operator+(&local_1dd8,&local_1df8,"Type(builder, _");
          std::operator+(&local_1db8,&local_1dd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         camel_name_3.field_2._8_8_);
          std::operator+(&local_1d98,&local_1db8,"_type);\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1d98);
          std::__cxx11::string::~string((string *)&local_1d98);
          std::__cxx11::string::~string((string *)&local_1db8);
          std::__cxx11::string::~string((string *)&local_1dd8);
          std::__cxx11::string::~string((string *)&local_1df8);
          std::operator+(&local_1e78,"    Add",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b98);
          std::operator+(&local_1e58,&local_1e78,"(builder, _");
          std::operator+(&local_1e38,&local_1e58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         camel_name_3.field_2._8_8_);
          std::operator+(&local_1e18,&local_1e38,");\n");
          std::__cxx11::string::operator+=
                    ((string *)struct_name.field_2._8_8_,(string *)&local_1e18);
          std::__cxx11::string::~string((string *)&local_1e18);
          std::__cxx11::string::~string((string *)&local_1e38);
          std::__cxx11::string::~string((string *)&local_1e58);
          std::__cxx11::string::~string((string *)&local_1e78);
        }
        std::__cxx11::string::~string((string *)local_1b98);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_1b68);
    }
    std::operator+(&local_1f38,"    return End",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_1f18,&local_1f38,"(builder);\n");
    std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,(string *)&local_1f18);
    std::__cxx11::string::~string((string *)&local_1f18);
    std::__cxx11::string::~string((string *)&local_1f38);
  }
  std::__cxx11::string::operator+=((string *)struct_name.field_2._8_8_,"  }\n");
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void GenPackUnPack_ObjectAPI(
      StructDef &struct_def, std::string *code_ptr, const IDLOptions &opts,
      bool struct_has_create,
      const std::set<FieldDef *> &field_has_create) const {
    auto &code = *code_ptr;
    auto struct_name = GenTypeName_ObjectAPI(struct_def.name, opts);
    // UnPack()
    code += "  public " + struct_name + " UnPack() {\n";
    code += "    var _o = new " + struct_name + "();\n";
    code += "    this.UnPackTo(_o);\n";
    code += "    return _o;\n";
    code += "  }\n";
    // UnPackTo()
    code += "  public void UnPackTo(" + struct_name + " _o) {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      auto start = "    _o." + camel_name + " = ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          auto fixed = struct_def.fixed && field.value.type.struct_def->fixed;
          if (fixed) {
            code += start + "this." + camel_name + ".UnPack();\n";
          } else {
            code += start + "this." + camel_name + ".HasValue ? this." +
                    camel_name + ".Value.UnPack() : null;\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
          auto length_str = NumToString(field.value.type.fixed_length);
          auto unpack_method = field.value.type.struct_def == nullptr ? ""
                               : field.value.type.struct_def->fixed
                                   ? ".UnPack()"
                                   : "?.UnPack()";
          code += start + "new " + type_name.substr(0, type_name.length() - 1) +
                  length_str + "];\n";
          code += "    for (var _j = 0; _j < " + length_str + "; ++_j) { _o." +
                  camel_name + "[_j] = this." + camel_name + "(_j)" +
                  unpack_method + "; }\n";
          break;
        }
        case BASE_TYPE_VECTOR:
          if (field.value.type.element == BASE_TYPE_UNION) {
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {\n";
            GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                     camel_name, camel_name_short, true);
            code += "    }\n";
          } else if (field.value.type.element != BASE_TYPE_UTYPE) {
            auto fixed = field.value.type.struct_def == nullptr;
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {";
            code += "_o." + camel_name + ".Add(";
            if (fixed) {
              code += "this." + camel_name + "(_j)";
            } else {
              code += "this." + camel_name + "(_j).HasValue ? this." +
                      camel_name + "(_j).Value.UnPack() : null";
            }
            code += ");}\n";
          }
          break;
        case BASE_TYPE_UTYPE: break;
        case BASE_TYPE_UNION: {
          GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                   camel_name, camel_name_short, false);
          break;
        }
        default: {
          code += start + "this." + camel_name + ";\n";
          break;
        }
      }
    }
    code += "  }\n";
    // Pack()
    code += "  public static " + GenOffsetType(struct_def) +
            " Pack(FlatBufferBuilder builder, " + struct_name + " _o) {\n";
    code += "    if (_o == null) return default(" + GenOffsetType(struct_def) +
            ");\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      // pre
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          if (!field.value.type.struct_def->fixed) {
            code += "    var _" + field.name + " = _o." + camel_name +
                    " == null ? default(" +
                    GenOffsetType(*field.value.type.struct_def) +
                    ") : " + GenTypeGet(field.value.type) +
                    ".Pack(builder, _o." + camel_name + ");\n";
          } else if (struct_def.fixed && struct_has_create) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          std::string create_string =
              field.shared ? "CreateSharedString" : "CreateString";
          code += "    var _" + field.name + " = _o." + camel_name +
                  " == null ? default(StringOffset) : "
                  "builder." +
                  create_string + "(_o." + camel_name + ");\n";
          break;
        }
        case BASE_TYPE_VECTOR: {
          if (field_has_create.find(&field) != field_has_create.end()) {
            auto property_name = camel_name;
            auto gen_for_loop = true;
            std::string array_name = "__" + field.name;
            std::string array_type = "";
            std::string to_array = "";
            switch (field.value.type.element) {
              case BASE_TYPE_STRING: {
                std::string create_string =
                    field.shared ? "CreateSharedString" : "CreateString";
                array_type = "StringOffset";
                to_array += "builder." + create_string + "(_o." +
                            property_name + "[_j])";
                break;
              }
              case BASE_TYPE_STRUCT:
                array_type = "Offset<" + GenTypeGet(field.value.type) + ">";
                to_array = GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                           property_name + "[_j])";
                break;
              case BASE_TYPE_UTYPE:
                property_name = camel_name.substr(0, camel_name.size() - 4);
                array_type = NamespacedName(*field.value.type.enum_def);
                to_array = "_o." + property_name + "[_j].Type";
                break;
              case BASE_TYPE_UNION:
                array_type = "int";
                to_array = NamespacedName(*field.value.type.enum_def) +
                           "Union.Pack(builder,  _o." + property_name + "[_j])";
                break;
              default: gen_for_loop = false; break;
            }
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + property_name + " != null) {\n";
            if (gen_for_loop) {
              code += "      var " + array_name + " = new " + array_type +
                      "[_o." + property_name + ".Count];\n";
              code += "      for (var _j = 0; _j < " + array_name +
                      ".Length; ++_j) { ";
              code += array_name + "[_j] = " + to_array + "; }\n";
            } else {
              code += "      var " + array_name + " = _o." + property_name +
                      ".ToArray();\n";
            }
            code += "      _" + field.name + " = Create" + camel_name_short +
                    "Vector(builder, " + array_name + ");\n";
            code += "    }\n";
          } else {
            auto pack_method =
                field.value.type.struct_def == nullptr
                    ? "builder.Add" + GenMethod(field.value.type.VectorType()) +
                          "(_o." + camel_name + "[_j]);"
                    : GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                          camel_name + "[_j]);";
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + camel_name + " != null) {\n";
            code += "      Start" + camel_name_short + "Vector(builder, _o." +
                    camel_name + ".Count);\n";
            code += "      for (var _j = _o." + camel_name +
                    ".Count - 1; _j >= 0; --_j) { " + pack_method + " }\n";
            code += "      _" + field.name + " = builder.EndVector();\n";
            code += "    }\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          if (field.value.type.struct_def != nullptr) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          } else {
            code += "    var _" + field.name + " = _o." + camel_name + ";\n";
          }
          break;
        }
        case BASE_TYPE_UNION: {
          code += "    var _" + field.name + "_type = _o." + camel_name +
                  " == null ? " + NamespacedName(*field.value.type.enum_def) +
                  ".NONE : " + "_o." + camel_name + ".Type;\n";
          code +=
              "    var _" + field.name + " = _o." + camel_name +
              " == null ? 0 : " + GenTypeGet_ObjectAPI(field.value.type, opts) +
              ".Pack(builder, _o." + camel_name + ");\n";
          break;
        }
        default: break;
      }
    }
    if (struct_has_create) {
      // Create
      code += "    return Create" + struct_def.name + "(\n";
      code += "      builder";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        if (camel_name == struct_def.name) { camel_name += "_"; }
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (struct_def.fixed) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              if (field.value.type.struct_def->fixed) {
                if (opts.generate_object_based_api)
                  code += "      _o." + camel_name;
                else
                  code += "      " + GenTypeGet(field.value.type) +
                          ".Pack(builder, _o." + camel_name + ")";
              } else {
                code += "      _" + field.name;
              }
            }
            break;
          }
          case BASE_TYPE_ARRAY: {
            if (field.value.type.struct_def != nullptr) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              code += "      _" + field.name;
            }
            break;
          }
          case BASE_TYPE_UNION: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_UTYPE: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_VECTOR: {
            code += ",\n";
            code += "      _" + field.name;
            break;
          }
          default:  // scalar
            code += ",\n";
            code += "      _o." + camel_name;
            break;
        }
      }
      code += ");\n";
    } else {
      // Start, End
      code += "    Start" + struct_def.name + "(builder);\n";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (field.value.type.struct_def->fixed) {
              code += "    Add" + camel_name + "(builder, " +
                      GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                      camel_name + "));\n";
            } else {
              code +=
                  "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            }
            break;
          }
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_VECTOR: {
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          case BASE_TYPE_UTYPE: break;
          case BASE_TYPE_UNION: {
            code += "    Add" + camel_name + "Type(builder, _" + field.name +
                    "_type);\n";
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          // scalar
          default: {
            code +=
                "    Add" + camel_name + "(builder, _o." + camel_name + ");\n";
            break;
          }
        }
      }
      code += "    return End" + struct_def.name + "(builder);\n";
    }
    code += "  }\n";
  }